

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O3

World * rw::World::create(BBox *bbox)

{
  World *object;
  
  allocLocation =
       "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/world.cpp line: 24";
  object = (World *)(*Engine::memfuncs)((long)s_plglist,0x3000b);
  if (object == (World *)0x0) {
    create();
  }
  else {
    numAllocated = numAllocated + 1;
    (object->object).type = '\a';
    (object->object).subType = '\0';
    (object->object).flags = '\0';
    (object->object).privateFlags = '\0';
    (object->object).parent = (void *)0x0;
    (object->localLights).link.next = &(object->localLights).link;
    (object->localLights).link.prev = &(object->localLights).link;
    (object->globalLights).link.next = &(object->globalLights).link;
    (object->globalLights).link.prev = &(object->globalLights).link;
    (object->clumps).link.next = &(object->clumps).link;
    (object->clumps).link.prev = &(object->clumps).link;
    PluginList::construct((PluginList *)&s_plglist,object);
  }
  return object;
}

Assistant:

World*
World::create(BBox *bbox)
{
	World *world = (World*)rwMalloc(s_plglist.size, MEMDUR_EVENT | ID_WORLD);
	if(world == nil){
		RWERROR((ERR_ALLOC, s_plglist.size));
		return nil;
	}
	numAllocated++;
	world->object.init(World::ID, 0);
	world->localLights.init();
	world->globalLights.init();
	world->clumps.init();
	s_plglist.construct(world);
	return world;
}